

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void install_subsample_code(FMFormat f,char *field,char *code_str)

{
  int iVar1;
  cod_parse_context context;
  cod_code p_Var2;
  field_marshal_info_conflict pfVar3;
  cod_exec_context pcVar4;
  char *in_RDX;
  cod_parse_context in_RSI;
  char *in_RDI;
  int field_num;
  int i;
  cod_parse_context parse_context;
  field_marshal_info_conflict marshal_info;
  _func_int_cod_exec_context_void_ptr_int *func;
  cod_code code;
  int iVar5;
  int iVar6;
  cod_parse_context in_stack_ffffffffffffffd0;
  FMFormat in_stack_ffffffffffffffd8;
  _func_int_cod_exec_context_void_ptr_int *p_Var7;
  char *in_stack_ffffffffffffffe0;
  
  context = new_cod_parse_context();
  iVar5 = -1;
  install_subsample_code::externs[0].extern_value = printf;
  install_subsample_code::externs[1].extern_value = malloc;
  install_subsample_code::externs[2].extern_value = memcpy;
  install_subsample_code::externs[3].extern_value = copy_array_element;
  for (iVar6 = 0; iVar6 < *(int *)(in_RDI + 0x44); iVar6 = iVar6 + 1) {
    iVar1 = strcmp(*(char **)(*(long *)(in_RDI + 0x78) + (long)iVar6 * 0x18),(char *)in_RSI);
    if (iVar1 == 0) {
      iVar5 = iVar6;
    }
  }
  if (iVar5 == -1) {
    printf("field \"%s\" not found in install subsample code\n",in_RSI);
  }
  else {
    cod_add_param(in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8,
                  (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),context);
    add_param(in_RSI,in_RDX,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
              in_stack_ffffffffffffffd8);
    cod_add_param(in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8,
                  (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),context);
    cod_set_return_type(in_stack_ffffffffffffffe0,(cod_parse_context)in_stack_ffffffffffffffd8);
    cod_assoc_externs(in_stack_ffffffffffffffd0,(cod_extern_list)context);
    cod_parse_for_context((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    p_Var2 = cod_code_gen(in_RDI,in_RSI);
    cod_free_parse_context((cod_parse_context)CONCAT44(iVar6,iVar5));
    if (p_Var2 == (cod_code)0x0) {
      printf("Compilation failed, field \"%s\" in install subsample code \n",in_RSI);
    }
    else {
      p_Var7 = (_func_int_cod_exec_context_void_ptr_int *)p_Var2->func;
      pfVar3 = add_marshal_info((FMFormat)CONCAT44(iVar6,iVar5));
      pcVar4 = cod_create_exec_context((cod_code)CONCAT44(iVar6,iVar5));
      pfVar3->ec = pcVar4;
      pfVar3->t = (FMTypeDesc *)(*(long *)(in_RDI + 0x80) + (long)iVar5 * 0x40 + 0x20);
      pfVar3->type = FFSSubsampleArrayField;
      pfVar3->subsample_array_func = p_Var7;
    }
  }
  return;
}

Assistant:

extern void
install_subsample_code(FMFormat f, char *field, char*code_str)
{
    cod_code code;
    int (*func)(cod_exec_context, void *, int);
    field_marshal_info marshal_info;
    cod_parse_context parse_context = new_cod_parse_context();
    int i, field_num = -1;

    static char extern_string[] = "\
		int printf(string format, ...);\n\
		void *malloc(int size);\n\
		void memcpy(void* dest, void* src, int size);\n\
        void FFSMarshalArrayElement(cod_exec_context ec, int element);";

    static cod_extern_entry externs[] = {
	{"printf", (void *) 0},
	{"malloc", (void*) 0},
	{"memcpy", (void*) 0},
	{"FFSMarshalArrayElement", (void*) 0},
	{(void *) 0, (void *) 0}
    };

    /*
     * some compilers think it isn't a static initialization to put this
     * in the structure above, so do it explicitly.
     */
    externs[0].extern_value = (void *) (intptr_t) printf;
    externs[1].extern_value = (void *) (intptr_t) malloc;
    externs[2].extern_value = (void *) (intptr_t) memcpy;
    externs[3].extern_value = (void *) (intptr_t) copy_array_element;


    for (i=0; i< f->field_count; i++) {
	if (strcmp(f->field_list[i].field_name, field) == 0) field_num = i;
    }
    if (field_num == -1) {
	printf("field \"%s\" not found in install subsample code\n", field);
	return;
    }
    cod_add_param("ec", "cod_exec_context", 0, parse_context);
    add_param(parse_context, "input", 1, f);
    cod_add_param("element_count", "int", 2, parse_context);

    cod_set_return_type("void", parse_context);
    cod_assoc_externs(parse_context, externs);
    cod_parse_for_context(extern_string, parse_context);

    code = cod_code_gen(code_str, parse_context);
    cod_free_parse_context(parse_context);
    if (code == NULL) {
	printf("Compilation failed, field \"%s\" in install subsample code \n", field);
	return;
    }
    func = (int(*)(cod_exec_context, void *, int))code->func;
    marshal_info = add_marshal_info(f);
    marshal_info->ec = cod_create_exec_context(code);
    marshal_info->t = &f->var_list[field_num].type_desc;
    marshal_info->type = FFSSubsampleArrayField;
    marshal_info->subsample_array_func = func;
}